

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec3 vec3_orthogonal(vec3 u)

{
  _Bool _Var1;
  float fVar2;
  vec3 vVar3;
  undefined4 local_18;
  undefined4 uStack_14;
  
  vVar3 = vec3_normalize(u);
  fVar2 = vVar3.z;
  _Var1 = vec3_equal(vVar3,(vec3)ZEXT412(0x3f800000));
  if (_Var1) {
    local_18 = 0.0;
    uStack_14 = 1.0;
    fVar2 = 0.0;
  }
  else {
    local_18 = vVar3.x;
    uStack_14 = vVar3.y;
  }
  vVar3.y = uStack_14;
  vVar3.x = local_18;
  vVar3.z = fVar2;
  vVar3 = vec3_cross(vVar3,(vec3)ZEXT412(0x3f800000));
  return vVar3;
}

Assistant:

vec3 vec3_orthogonal(vec3 u) {
    u = vec3_normalize(u);
    vec3 v = V3(1.0f, 0.0f, 0.0f);
    if (vec3_equal(u, v)) {
        u = V3(0.0f, 1.0f, 0.0f);
    }
    return vec3_cross(u, v);
}